

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceSupportTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  ostringstream *this;
  Vector<unsigned_int,_2> *log;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar1;
  VkBool32 VVar2;
  qpTestResult qVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  ResultCollector results;
  InstanceHelper instHelper;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_430;
  Vector<unsigned_int,_2> *local_418;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_410;
  uint local_408 [2];
  VkAllocationCallbacks *pVStack_400;
  TestStatus *local_3f8;
  Vector<unsigned_int,_2> *local_3f0;
  VkSurfaceKHR local_3e8;
  ulong local_3e0;
  ResultCollector local_3d8;
  NativeObjects local_388;
  undefined1 local_368 [16];
  Vector<unsigned_int,_2> local_358;
  VkAllocationCallbacks *pVStack_350;
  ios_base local_2f0 [264];
  undefined1 local_1e8 [32];
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  log = (Vector<unsigned_int,_2> *)context->m_testCtx->m_log;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  tcu::ResultCollector::ResultCollector(&local_3d8,(TestLog *)log,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_368._0_8_ = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_388,(Context *)context->m_testCtx->m_platform,(Extensions *)local_1e8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_368);
  local_3f8 = __return_storage_ptr__;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,&local_1b8.super_InstanceInterface,
             (VkInstance)local_1e8._24_8_,wsiType,
             local_388.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_388.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_408[0] = local_358.m_data[0];
  local_408[1] = local_358.m_data[1];
  pVStack_400 = pVStack_350;
  local_418 = (Vector<unsigned_int,_2> *)local_368._0_8_;
  aStack_410.m_align = local_368._8_8_;
  local_3f0 = log;
  ::vk::enumeratePhysicalDevices
            (&local_430,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_);
  if (local_430.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_430.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this = (ostringstream *)(local_368 + 8);
    uVar5 = 0;
    do {
      physicalDevice =
           local_430.
           super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar5];
      local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
      (*local_1b8.super_InstanceInterface._vptr_InstanceInterface[6])
                (&local_1b8,physicalDevice,(MessageBuilder *)local_368,0);
      local_3e0 = local_368._0_8_ & 0xffffffff;
      if (local_3e0 != 0) {
        local_3e8.m_internal = (deUint64)local_418;
        uVar6 = 0;
        do {
          VVar2 = ::vk::wsi::getPhysicalDeviceSurfaceSupport
                            (&local_1b8.super_InstanceInterface,physicalDevice,(deUint32)uVar6,
                             local_3e8);
          local_368._0_8_ = local_3f0;
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Device ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", queue family ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
          pcVar4 = "";
          if (VVar2 == 0) {
            pcVar4 = "NOT ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,pcVar4,(ulong)(VVar2 == 0) << 2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"supported",9);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          std::ios_base::~ios_base(local_2f0);
          if ((wsiType == TYPE_ANDROID) && (VVar2 == 0)) {
            local_368._0_8_ = &local_358;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,
                       "Surface must be supported by all devices and queue families","");
            tcu::ResultCollector::fail(&local_3d8,(string *)local_368);
            if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
            }
          }
          uVar6 = uVar6 + 1;
        } while (local_3e0 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_430.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_430.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  qVar3 = tcu::ResultCollector::getResult(&local_3d8);
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,local_3d8.m_message._M_dataplus._M_p,
             local_3d8.m_message._M_dataplus._M_p + local_3d8.m_message._M_string_length);
  pTVar1 = local_3f8;
  local_3f8->m_code = qVar3;
  (local_3f8->m_description)._M_dataplus._M_p = (pointer)&(local_3f8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8->m_description,local_368._0_8_,local_368._8_8_ + local_368._0_8_);
  if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
  }
  if (local_430.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_418 != (Vector<unsigned_int,_2> *)0x0) {
    (**(code **)(*(long *)aStack_410 + 0x68))(aStack_410.m_align,local_408,local_418,pVStack_400);
  }
  (*(local_388.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data
    .ptr)->_vptr_Window[1])();
  (*(local_388.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
     m_data.ptr)->_vptr_Display[1])();
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if ((VkInstance)local_1e8._24_8_ != (VkInstance)0x0) {
    (*p_Stack_1c8)((VkInstance)local_1e8._24_8_,local_1c0);
  }
  local_1e8._24_8_ = 0;
  p_Stack_1c8 = (DestroyInstanceFunc)0x0;
  local_1c0 = (VkAllocationCallbacks *)0x0;
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
    operator_delete(local_3d8.m_message._M_dataplus._M_p,
                    local_3d8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_prefix._M_dataplus._M_p != &local_3d8.m_prefix.field_2) {
    operator_delete(local_3d8.m_prefix._M_dataplus._M_p,
                    local_3d8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus querySurfaceSupportTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	tcu::ResultCollector			results					(log);

	const InstanceHelper			instHelper				(context, wsiType);
	const NativeObjects				native					(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface					(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices			= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	// On Android surface must be supported by all devices and queue families
	const bool						expectSupportedOnAll	= wsiType == TYPE_ANDROID;

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice		physicalDevice		= physicalDevices[deviceNdx];
		const deUint32				numQueueFamilies	= getNumQueueFamilies(instHelper.vki, physicalDevice);

		for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < numQueueFamilies; ++queueFamilyNdx)
		{
			const VkBool32	isSupported		= getPhysicalDeviceSurfaceSupport(instHelper.vki, physicalDevice, queueFamilyNdx, *surface);

			log << TestLog::Message << "Device " << deviceNdx << ", queue family " << queueFamilyNdx << ": "
									<< (isSupported == VK_FALSE ? "NOT " : "") << "supported"
				<< TestLog::EndMessage;

			if (expectSupportedOnAll && !isSupported)
				results.fail("Surface must be supported by all devices and queue families");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}